

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bash_prg.c
# Opt level: O2

void bashPrgStart(void *state,size_t l,size_t d,octet *ann,size_t ann_len,octet *key,size_t key_len)

{
  size_t sVar1;
  
  *(size_t *)((long)state + 0xd8) = ann_len + key_len + 1;
  *(char *)((long)state + 0x10) = (char)(key_len >> 2) + (char)ann_len * '\x04';
  memCopy((void *)((long)state + 0x11),ann,ann_len);
  memCopy((void *)((long)state + ann_len + 0x11),key,key_len);
  memSet((void *)((long)state + *(long *)((long)state + 0xd8) + 0x10),'\0',
         0xc0 - *(long *)((long)state + 0xd8));
  *(char *)((long)state + 200) = (char)(l >> 2) + (char)d;
  sVar1 = d + 2;
  if (key_len == 0) {
    sVar1 = d;
  }
  *(size_t *)((long)state + 0xd0) = 0xc0 - (sVar1 * l >> (key_len != 0) * '\x02' + 2);
  *(size_t *)state = l;
  *(size_t *)((long)state + 8) = d;
  return;
}

Assistant:

void bashPrgStart(void* state, size_t l, size_t d, const octet ann[],
	size_t ann_len, const octet key[], size_t key_len)
{
	bash_prg_st* st = (bash_prg_st*)state;
	ASSERT(memIsValid(st, bashPrg_keep()));
	ASSERT(l == 128 || l == 192 || l == 256);
	ASSERT(d == 1 || d == 2);
	ASSERT(ann_len % 4 == 0 && ann_len <= 60);
	ASSERT(key_len % 4 == 0 && key_len <= 60);
	ASSERT(key_len == 0 || key_len >= l / 8);
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), ann, ann_len));
	ASSERT(memIsDisjoint2(st, bashPrg_keep(), key, key_len));
	// pos <- 8 + |ann| + |key|
	st->pos = 1 + ann_len + key_len;
	// s[0..pos) <- <|ann|/2 + |key|/32>_8 || ann || key
	st->s[0] = (octet)(ann_len * 4 + key_len / 4);
	memCopy(st->s + 1, ann, ann_len); 
	memCopy(st->s + 1 + ann_len, key, key_len);
	// s[pos..) <- 0
	memSetZero(st->s + st->pos, 192 - st->pos);
	// s[1472..) <- <l / 4 + d>_{64}
	st->s[192 - 8] = (octet)(l / 4  + d);
	// длина буфера
	st->buf_len = key_len ? (192 - l * (2 + d) / 16) : (192 - d * l / 4);
	// сохранить параметры
	st->l = l, st->d = d;
}